

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_token_iterator.h
# Opt level: O1

void __thiscall string_token_iterator::find_next(string_token_iterator *this)

{
  char *pcVar1;
  string *psVar2;
  ulong uVar3;
  size_type sVar4;
  
  pcVar1 = this->separator;
  psVar2 = this->str;
  uVar3 = this->end;
  strlen(pcVar1);
  uVar3 = std::__cxx11::string::find_first_not_of((char *)psVar2,(ulong)pcVar1,uVar3);
  this->start = uVar3;
  if (uVar3 == 0xffffffffffffffff) {
    this->str = (string *)0x0;
    this->start = 0;
    this->end = 0;
  }
  else {
    pcVar1 = this->separator;
    psVar2 = this->str;
    strlen(pcVar1);
    sVar4 = std::__cxx11::string::find_first_of((char *)psVar2,(ulong)pcVar1,uVar3);
    this->end = sVar4;
  }
  return;
}

Assistant:

void find_next(void)
  {
    start = str->find_first_not_of(separator, end);
    if(start == std::string::npos)
    {
      start = end = 0;
      str = 0;
      return;
    }

    end = str->find_first_of(separator, start);
  }